

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict abstract_declarator(c2m_ctx_t c2m_ctx,int no_err_p)

{
  node_t pnVar1;
  node_t pnVar2;
  node_t pnVar3;
  node_t_conflict n;
  size_t mark;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  anon_union_16_10_0af5b411_for_u *paVar6;
  node_t op;
  pos_t p;
  
  if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x2a) {
    n = pointer(c2m_ctx,no_err_p);
    if (n == &err_struct) {
      return &err_struct;
    }
    mark = record_start(c2m_ctx);
    pnVar4 = direct_abstract_declarator(c2m_ctx,1);
    record_stop(c2m_ctx,mark,(uint)(pnVar4 == &err_struct));
    if (pnVar4 == &err_struct) {
      p = get_node_pos(c2m_ctx,n);
      pnVar4 = new_node(c2m_ctx,N_IGNORE);
      pnVar5 = new_node(c2m_ctx,N_LIST);
      pnVar4 = new_node2(c2m_ctx,N_DECL,pnVar4,pnVar5);
      add_pos(c2m_ctx,pnVar4,p);
    }
  }
  else {
    pnVar4 = direct_abstract_declarator(c2m_ctx,no_err_p);
    if (pnVar4 == &err_struct) {
      return &err_struct;
    }
    n = (node_t_conflict)0x0;
  }
  if (n != (node_t_conflict)0x0) {
    pnVar5 = (((pnVar4->u).ops.head)->op_link).next;
    if (pnVar5->code != N_LIST) {
LAB_00199850:
      __assert_fail("list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1366,"node_t abstract_declarator(c2m_ctx_t, int)");
    }
    op = (n->u).ops.head;
    if (op != (node_t)0x0) {
      do {
        pnVar1 = (op->op_link).prev;
        pnVar2 = (op->op_link).next;
        if (pnVar1 == (node_t)0x0) {
          paVar6 = &n->u;
          if ((node_t_conflict)(n->u).s.s == op) goto LAB_001997f9;
LAB_0019984b:
          abstract_declarator_cold_1();
          goto LAB_00199850;
        }
        paVar6 = (anon_union_16_10_0af5b411_for_u *)&(pnVar1->op_link).next;
LAB_001997f9:
        (paVar6->ops).head = pnVar2;
        pnVar3 = (op->op_link).next;
        if (pnVar3 == (node_t)0x0) {
          if ((node_t_conflict)(n->u).s.len != op) {
            abstract_declarator_cold_2();
            goto LAB_0019984b;
          }
          (n->u).ops.tail = pnVar1;
        }
        else {
          (pnVar3->op_link).prev = pnVar1;
        }
        (op->op_link).prev = (node_t)0x0;
        (op->op_link).next = (node_t)0x0;
        op_append(c2m_ctx,pnVar5,op);
        op = pnVar2;
      } while (pnVar2 != (node_t)0x0);
    }
  }
  return pnVar4;
}

Assistant:

D (abstract_declarator) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, p = NULL, r, el, next_el;

  if (C ('*')) {
    P (pointer);
    p = r;
    if ((r = TRY (direct_abstract_declarator)) == err_node)
      r = new_pos_node2 (c2m_ctx, N_DECL, POS (p), new_node (c2m_ctx, N_IGNORE),
                         new_node (c2m_ctx, N_LIST));
  } else {
    P (direct_abstract_declarator);
  }
  if (p != NULL) {
    list = NL_NEXT (NL_HEAD (r->u.ops));
    assert (list->code == N_LIST);
    for (el = NL_HEAD (p->u.ops); el != NULL; el = next_el) {
      next_el = NL_NEXT (el);
      NL_REMOVE (p->u.ops, el);
      op_append (c2m_ctx, list, el);
    }
  }
  return r;
}